

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

__int128 * __thiscall
calculator::ExpressionParser<__int128>::checkZero
          (__int128 *__return_storage_ptr__,ExpressionParser<__int128> *this,__int128 value)

{
  long lVar1;
  error *this_00;
  ostream *poVar2;
  long in_RDX;
  string divOperators;
  ostringstream msg;
  string local_1d8;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  ostringstream local_198 [376];
  
  if (this != (ExpressionParser<__int128> *)0x0 || in_RDX != 0) {
    return (__int128 *)this;
  }
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/%","");
  lVar1 = std::__cxx11::string::find_last_of
                    ((char *)__return_storage_ptr__,(ulong)local_1b8[0],
                     (long)__return_storage_ptr__[2] - 2);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Parser error: division by 0",0x1b);
  if (lVar1 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198," (error token is \"",0x12);
    std::__cxx11::string::substr((ulong)&local_1d8,(ulong)__return_storage_ptr__);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\")",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  error::error(this_00,(string *)__return_storage_ptr__,&local_1d8);
  __cxa_throw(this_00,&error::typeinfo,error::~error);
}

Assistant:

T checkZero(T value) const
  {
    if (value == 0)
    {
      std::string divOperators("/%");
      std::size_t division = expr_.find_last_of(divOperators, index_ - 2);
      std::ostringstream msg;
      msg << "Parser error: division by 0";
      if (division != std::string::npos)
        msg << " (error token is \""
            << expr_.substr(division, expr_.size() - division)
            << "\")";
      throw calculator::error(expr_, msg.str());
    }
    return value;
  }